

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

size_t __thiscall
proto2_unittest::TestPackedExtensionsLite::ByteSizeLong(TestPackedExtensionsLite *this)

{
  bool bVar1;
  int desired;
  long lVar2;
  size_t sStack_20;
  uint32_t cached_has_bits;
  size_t total_size;
  TestPackedExtensionsLite *this_;
  TestPackedExtensionsLite *this_local;
  
  sStack_20 = google::protobuf::internal::ExtensionSet::ByteSize
                        (&(this->field_0)._impl_._extensions_);
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar2 = std::__cxx11::string::size();
    sStack_20 = lVar2 + sStack_20;
  }
  desired = google::protobuf::internal::ToCachedSize(sStack_20);
  google::protobuf::internal::CachedSize::Set(&(this->field_0)._impl_._cached_size_,desired);
  return sStack_20;
}

Assistant:

::size_t TestPackedExtensionsLite::ByteSizeLong() const {
  const TestPackedExtensionsLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestPackedExtensionsLite)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}